

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void bfgs_iter_middle<dense_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               dense_parameters *weights)

{
  float fVar1;
  double dVar2;
  dense_parameters *pdVar3;
  bool bVar4;
  uint32_t uVar5;
  char *pcVar6;
  float *pfVar7;
  undefined8 uVar8;
  double *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  dense_parameters *in_RDX;
  long in_RSI;
  dense_iterator<float> *pdVar9;
  long in_RDI;
  double *in_R8;
  int *in_R9;
  float fVar10;
  float fVar11;
  int *in_stack_00000008;
  dense_parameters *in_stack_00000010;
  int j_2;
  iterator w_7;
  iterator w_6;
  iterator w_5;
  int j_1;
  double coef_j;
  iterator w_4;
  double y_r;
  iterator w_3;
  int j;
  float gamma;
  float *mem1;
  iterator w_2;
  double s_q;
  double y_Hy;
  double y_s;
  iterator w_1;
  float beta;
  iterator w;
  double y;
  double g_Hg;
  double g_Hy;
  uint32_t length;
  float *mem0;
  curv_exception *in_stack_fffffffffffffc18;
  curv_exception *in_stack_fffffffffffffc20;
  dense_parameters *in_stack_fffffffffffffc30;
  int local_3bc;
  int local_224;
  dense_iterator<float> local_220;
  dense_iterator<float> local_208;
  dense_iterator<float> local_1f0;
  dense_iterator<float> local_1d8;
  dense_iterator<float> local_1c0;
  dense_iterator<float> local_1a8;
  int local_18c;
  double local_188;
  dense_iterator<float> local_180;
  dense_iterator<float> local_168;
  double local_150;
  dense_iterator<float> local_148;
  dense_iterator<float> local_130;
  int local_118;
  float local_114;
  long local_110;
  dense_iterator<float> local_108;
  dense_iterator<float> local_f0;
  double local_d8;
  double local_d0;
  double local_c8;
  dense_iterator<float> local_c0;
  dense_iterator<float> local_a8;
  float local_8c;
  dense_iterator<float> local_88;
  dense_iterator<float> local_70;
  double local_58;
  double local_50;
  double local_48;
  int local_3c;
  dense_parameters *local_38;
  int *local_30;
  double *local_28;
  double *local_20;
  dense_parameters *local_18;
  long local_10;
  long local_8;
  
  local_3c = 1 << ((byte)*(undefined4 *)(in_RDI + 0x50) & 0x1f);
  local_38 = in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(int *)(in_RSI + 8) == 0) {
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    local_8 = in_RDI;
    dense_parameters::begin(in_stack_fffffffffffffc30);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffc30);
      pdVar9 = &local_88;
      bVar4 = dense_iterator<float>::operator!=(&local_70,pdVar9);
      pdVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = dense_iterator<float>::index(&local_70,(char *)pdVar9,__c);
      uVar5 = dense_parameters::stride_shift(in_stack_00000010);
      local_18 = (dense_parameters *)
                 ((long)&pdVar3->_begin +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_70);
      local_58 = (double)(pfVar7[1] -
                         *(float *)((long)&local_18->_begin +
                                   (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4));
      pfVar7 = dense_iterator<float>::operator*(&local_70);
      fVar1 = pfVar7[1];
      pfVar7 = dense_iterator<float>::operator*(&local_70);
      local_48 = (double)fVar1 * (double)pfVar7[3] * local_58 + local_48;
      fVar1 = *(float *)((long)&local_18->_begin +
                        (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_70);
      local_50 = (double)fVar1 * (double)pfVar7[3] *
                 (double)*(float *)((long)&local_18->_begin +
                                   (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) +
                 local_50;
      dense_iterator<float>::operator++(&local_70);
    }
    local_8c = (float)(local_48 / local_50);
    if ((local_8c < 0.0) || (bVar4 = nanpattern(0.0), bVar4)) {
      local_8c = 0.0;
    }
    dense_parameters::begin(in_stack_fffffffffffffc30);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffc30);
      pdVar9 = &local_c0;
      bVar4 = dense_iterator<float>::operator!=(&local_a8,pdVar9);
      pdVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = dense_iterator<float>::index(&local_a8,(char *)pdVar9,__c_00);
      uVar5 = dense_parameters::stride_shift(in_stack_00000010);
      local_18 = (dense_parameters *)
                 ((long)&pdVar3->_begin +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_a8);
      fVar1 = local_8c;
      *(float *)((long)&local_18->_begin +
                (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) = pfVar7[1];
      pfVar7 = dense_iterator<float>::operator*(&local_a8);
      pfVar7[2] = fVar1 * pfVar7[2];
      pfVar7 = dense_iterator<float>::operator*(&local_a8);
      fVar1 = pfVar7[3];
      pfVar7 = dense_iterator<float>::operator*(&local_a8);
      fVar10 = pfVar7[1];
      pfVar7 = dense_iterator<float>::operator*(&local_a8);
      pfVar7[2] = -fVar1 * fVar10 + pfVar7[2];
      pfVar7 = dense_iterator<float>::operator*(&local_a8);
      pfVar7[1] = 0.0;
      dense_iterator<float>::operator++(&local_a8);
    }
    if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
      fprintf(_stderr,"%f\t",(double)local_8c);
    }
  }
  else {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    if ((*(byte *)(in_RDI + 0x3439) & 1) == 0) {
      fprintf(_stderr,"%-10s\t","");
    }
    local_c8 = 0.0;
    local_d0 = 0.0;
    local_d8 = 0.0;
    dense_parameters::begin(in_stack_fffffffffffffc30);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffc30);
      pdVar9 = &local_108;
      bVar4 = dense_iterator<float>::operator!=(&local_f0,pdVar9);
      pdVar3 = local_18;
      if (!bVar4) break;
      pcVar6 = dense_iterator<float>::index(&local_f0,(char *)pdVar9,__c_01);
      uVar5 = dense_parameters::stride_shift(in_stack_00000010);
      local_110 = (long)&pdVar3->_begin +
                  ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4;
      pfVar7 = dense_iterator<float>::operator*(&local_f0);
      *(float *)(local_110 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) =
           pfVar7[1] -
           *(float *)(local_110 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_f0);
      *(float *)(local_110 + (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4) =
           *pfVar7 - *(float *)(local_110 +
                               (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_f0);
      fVar1 = pfVar7[1];
      pfVar7 = dense_iterator<float>::operator*(&local_f0);
      pfVar7[2] = fVar1;
      local_c8 = (double)*(float *)(local_110 +
                                   (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) *
                 (double)*(float *)(local_110 +
                                   (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4)
                 + local_c8;
      fVar1 = *(float *)(local_110 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      fVar10 = *(float *)(local_110 + (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_f0);
      local_d0 = (double)fVar1 * (double)fVar10 * (double)pfVar7[3] + local_d0;
      fVar1 = *(float *)(local_110 +
                        (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_f0);
      local_d8 = (double)fVar1 * (double)pfVar7[1] + local_d8;
      dense_iterator<float>::operator++(&local_f0);
    }
    if ((local_c8 <= 0.0) || (local_d0 <= 0.0)) {
      uVar8 = __cxa_allocate_exception(8);
      curv_exception::curv_exception(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      __cxa_throw(uVar8,&curv_exception::typeinfo,curv_exception::~curv_exception);
    }
    *local_20 = 1.0 / local_c8;
    local_114 = (float)(local_c8 / local_d0);
    for (local_118 = 0; local_118 < *local_30; local_118 = local_118 + 1) {
      local_28[local_118] = local_20[local_118] * local_d8;
      local_d8 = 0.0;
      dense_parameters::begin(in_stack_fffffffffffffc30);
      while( true ) {
        dense_parameters::end(in_stack_fffffffffffffc30);
        pdVar9 = &local_148;
        bVar4 = dense_iterator<float>::operator!=(&local_130,pdVar9);
        pdVar3 = local_38;
        if (!bVar4) break;
        pcVar6 = dense_iterator<float>::index(&local_130,(char *)pdVar9,__c_02);
        uVar5 = dense_parameters::stride_shift(in_stack_00000010);
        local_18 = (dense_parameters *)
                   ((long)&pdVar3->_begin +
                   ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
        dVar2 = local_28[local_118];
        fVar1 = *(float *)((long)&local_18->_begin +
                          (long)((local_118 * 2 + *in_stack_00000008) % *(int *)(local_10 + 0xb4)) *
                          4);
        pfVar7 = dense_iterator<float>::operator*(&local_130);
        pfVar7[2] = -(float)dVar2 * fVar1 + pfVar7[2];
        fVar1 = *(float *)((long)&local_18->_begin +
                          (long)((local_118 * 2 + 3 + *in_stack_00000008) %
                                *(int *)(local_10 + 0xb4)) * 4);
        pfVar7 = dense_iterator<float>::operator*(&local_130);
        local_d8 = (double)fVar1 * (double)pfVar7[2] + local_d8;
        dense_iterator<float>::operator++(&local_130);
      }
    }
    local_28[*local_30] = local_20[*local_30] * local_d8;
    local_150 = 0.0;
    dense_parameters::begin(in_stack_fffffffffffffc30);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffc30);
      pdVar9 = &local_180;
      bVar4 = dense_iterator<float>::operator!=(&local_168,pdVar9);
      pdVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = dense_iterator<float>::index(&local_168,(char *)pdVar9,__c_03);
      uVar5 = dense_parameters::stride_shift(in_stack_00000010);
      local_18 = (dense_parameters *)
                 ((long)&pdVar3->_begin +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      dVar2 = local_28[*local_30];
      fVar1 = *(float *)((long)&local_18->_begin +
                        (long)((*local_30 * 2 + *in_stack_00000008) % *(int *)(local_10 + 0xb4)) * 4
                        );
      pfVar7 = dense_iterator<float>::operator*(&local_168);
      fVar10 = local_114;
      pfVar7[2] = -(float)dVar2 * fVar1 + pfVar7[2];
      pfVar7 = dense_iterator<float>::operator*(&local_168);
      fVar1 = pfVar7[3];
      pfVar7 = dense_iterator<float>::operator*(&local_168);
      pfVar7[2] = fVar10 * fVar1 * pfVar7[2];
      fVar1 = *(float *)((long)&local_18->_begin +
                        (long)((*local_30 * 2 + *in_stack_00000008) % *(int *)(local_10 + 0xb4)) * 4
                        );
      pfVar7 = dense_iterator<float>::operator*(&local_168);
      local_150 = (double)fVar1 * (double)pfVar7[2] + local_150;
      dense_iterator<float>::operator++(&local_168);
    }
    for (local_18c = *local_30; 0 < local_18c; local_18c = local_18c + -1) {
      local_188 = -local_20[local_18c] * local_150 + local_28[local_18c];
      local_150 = 0.0;
      dense_parameters::begin(in_stack_fffffffffffffc30);
      while( true ) {
        dense_parameters::end(in_stack_fffffffffffffc30);
        pdVar9 = &local_1c0;
        bVar4 = dense_iterator<float>::operator!=(&local_1a8,pdVar9);
        pdVar3 = local_38;
        if (!bVar4) break;
        pcVar6 = dense_iterator<float>::index(&local_1a8,(char *)pdVar9,__c_04);
        uVar5 = dense_parameters::stride_shift(in_stack_00000010);
        local_18 = (dense_parameters *)
                   ((long)&pdVar3->_begin +
                   ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
        fVar10 = (float)local_188;
        fVar1 = *(float *)((long)&local_18->_begin +
                          (long)((local_18c * 2 + 1 + *in_stack_00000008) %
                                *(int *)(local_10 + 0xb4)) * 4);
        pfVar7 = dense_iterator<float>::operator*(&local_1a8);
        pfVar7[2] = fVar10 * fVar1 + pfVar7[2];
        fVar1 = *(float *)((long)&local_18->_begin +
                          (long)((local_18c * 2 + -2 + *in_stack_00000008) %
                                *(int *)(local_10 + 0xb4)) * 4);
        pfVar7 = dense_iterator<float>::operator*(&local_1a8);
        local_150 = (double)fVar1 * (double)pfVar7[2] + local_150;
        dense_iterator<float>::operator++(&local_1a8);
      }
    }
    local_188 = -*local_20 * local_150 + *local_28;
    dense_parameters::begin(in_stack_fffffffffffffc30);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffc30);
      pdVar9 = &local_1f0;
      bVar4 = dense_iterator<float>::operator!=(&local_1d8,pdVar9);
      pdVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = dense_iterator<float>::index(&local_1d8,(char *)pdVar9,__c_05);
      uVar5 = dense_parameters::stride_shift(in_stack_00000010);
      local_18 = (dense_parameters *)
                 ((long)&pdVar3->_begin +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_1d8);
      fVar1 = pfVar7[2];
      fVar11 = (float)local_188;
      fVar10 = *(float *)((long)&local_18->_begin +
                         (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_1d8);
      pfVar7[2] = -fVar11 * fVar10 + -fVar1;
      dense_iterator<float>::operator++(&local_1d8);
    }
    if (*local_30 < *(int *)(local_10 + 8) + -1) {
      local_3bc = *local_30 + 1;
    }
    else {
      local_3bc = *(int *)(local_10 + 8) + -1;
    }
    *local_30 = local_3bc;
    *in_stack_00000008 =
         (*in_stack_00000008 + *(int *)(local_10 + 0xb4) + -2) % *(int *)(local_10 + 0xb4);
    dense_parameters::begin(in_stack_fffffffffffffc30);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffc30);
      pdVar9 = &local_220;
      bVar4 = dense_iterator<float>::operator!=(&local_208,pdVar9);
      pdVar3 = local_38;
      if (!bVar4) break;
      pcVar6 = dense_iterator<float>::index(&local_208,(char *)pdVar9,__c_06);
      uVar5 = dense_parameters::stride_shift(in_stack_00000010);
      local_18 = (dense_parameters *)
                 ((long)&pdVar3->_begin +
                 ((ulong)pcVar6 >> ((byte)uVar5 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4);
      pfVar7 = dense_iterator<float>::operator*(&local_208);
      *(float *)((long)&local_18->_begin +
                (long)(*in_stack_00000008 % *(int *)(local_10 + 0xb4)) * 4) = pfVar7[1];
      in_stack_fffffffffffffc30 = local_18;
      pfVar7 = dense_iterator<float>::operator*(&local_208);
      *(float *)((long)&local_18->_begin +
                (long)((*in_stack_00000008 + 1) % *(int *)(local_10 + 0xb4)) * 4) = *pfVar7;
      pfVar7 = dense_iterator<float>::operator*(&local_208);
      pfVar7[1] = 0.0;
      dense_iterator<float>::operator++(&local_208);
    }
    for (local_224 = *local_30; 0 < local_224; local_224 = local_224 + -1) {
      local_20[local_224] = local_20[local_224 + -1];
    }
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}